

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O2

void get_min_bsize(SIMPLE_MOTION_DATA_TREE *sms_tree,int *min_bw,int *min_bh)

{
  byte bVar1;
  BLOCK_SIZE BVar2;
  byte partition;
  uint uVar3;
  int i;
  long lVar4;
  
  if (sms_tree == (SIMPLE_MOTION_DATA_TREE *)0x0) {
    return;
  }
  if (sms_tree->block_size == BLOCK_4X4) {
    *min_bw = 0;
    uVar3 = 0;
  }
  else {
    bVar1 = sms_tree->partitioning;
    if (bVar1 == 0xff) {
      return;
    }
    if (bVar1 == 3) {
      for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
        get_min_bsize(sms_tree->split[lVar4],min_bw,min_bh);
      }
      return;
    }
    partition = 3;
    if ((bVar1 & 0xfc) != 4) {
      partition = bVar1;
    }
    BVar2 = get_partition_subsize(sms_tree->block_size,partition);
    if (BVar2 == BLOCK_INVALID) {
      return;
    }
    uVar3 = (uint)""[BVar2];
    if (*min_bw < (int)(uint)""[BVar2]) {
      uVar3 = *min_bw;
    }
    *min_bw = uVar3;
    uVar3 = (uint)""[BVar2];
    if (*min_bh < (int)(uint)""[BVar2]) {
      uVar3 = *min_bh;
    }
  }
  *min_bh = uVar3;
  return;
}

Assistant:

static inline void get_min_bsize(const SIMPLE_MOTION_DATA_TREE *sms_tree,
                                 int *min_bw, int *min_bh) {
  if (!sms_tree) return;

  const BLOCK_SIZE bsize = sms_tree->block_size;
  if (bsize == BLOCK_4X4) {
    *min_bw = 0;
    *min_bh = 0;
    return;
  }

  PARTITION_TYPE part_type = sms_tree->partitioning;
  if (part_type == PARTITION_INVALID) return;

  if (part_type == PARTITION_SPLIT) {
    for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
      get_min_bsize(sms_tree->split[i], min_bw, min_bh);
    }
  } else {
    if (part_type == PARTITION_HORZ_A || part_type == PARTITION_HORZ_B ||
        part_type == PARTITION_VERT_A || part_type == PARTITION_VERT_B)
      part_type = PARTITION_SPLIT;
    const BLOCK_SIZE subsize = get_partition_subsize(bsize, part_type);
    if (subsize != BLOCK_INVALID) {
      *min_bw = AOMMIN(*min_bw, mi_size_wide_log2[subsize]);
      *min_bh = AOMMIN(*min_bh, mi_size_high_log2[subsize]);
    }
  }
}